

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>_>
::drop_deletes_without_resize
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>_>
           *this)

{
  char *pcVar1;
  byte *pbVar2;
  ulong uVar3;
  ctrl_t *pcVar4;
  undefined1 auVar5 [16];
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  undefined8 uVar21;
  new_allocator<std::pair<std::__cxx11::string_const,std::function<bool(std::__cxx11::string_const&)>>>
  *this_00;
  ctrl_t *pcVar22;
  size_t sVar23;
  ulong uVar24;
  slot_type *psVar25;
  ulong uVar26;
  byte bVar27;
  size_t i;
  FindInfo FVar28;
  type raw;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_79;
  new_allocator<std::pair<std::__cxx11::string_const,std::function<bool(std::__cxx11::string_const&)>>>
  *local_78;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  local_70;
  
  uVar3 = this->capacity_;
  if ((uVar3 == 0) || ((uVar3 + 1 & uVar3) != 0)) {
    __assert_fail("IsValidCapacity(capacity_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x8f8,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::basic_string<char>, std::function<bool (const std::basic_string<char> &)>>, phmap::Hash<std::basic_string<char>>, phmap::EqualTo<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, std::function<bool (const std::basic_string<char> &)>>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashMapPolicy<std::basic_string<char>, std::function<bool (const std::basic_string<char> &)>>, Hash = phmap::Hash<std::basic_string<char>>, Eq = phmap::EqualTo<std::basic_string<char>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, std::function<bool (const std::basic_string<char> &)>>>]"
                 );
  }
  if (uVar3 < 0xf) {
    __assert_fail("!is_small()",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x8f9,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::basic_string<char>, std::function<bool (const std::basic_string<char> &)>>, phmap::Hash<std::basic_string<char>>, phmap::EqualTo<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, std::function<bool (const std::basic_string<char> &)>>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashMapPolicy<std::basic_string<char>, std::function<bool (const std::basic_string<char> &)>>, Hash = phmap::Hash<std::basic_string<char>>, Eq = phmap::EqualTo<std::basic_string<char>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, std::function<bool (const std::basic_string<char> &)>>>]"
                 );
  }
  pcVar4 = this->ctrl_;
  if (pcVar4[uVar3] != -1) {
    __assert_fail("ctrl[capacity] == kSentinel",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x270,"void phmap::priv::ConvertDeletedToEmptyAndFullToDeleted(ctrl_t *, size_t)"
                 );
  }
  pcVar22 = pcVar4 + uVar3;
  if (pcVar22 + 1 != pcVar4) {
    uVar26 = 0;
    do {
      pcVar1 = pcVar4 + uVar26;
      cVar6 = pcVar1[1];
      cVar7 = pcVar1[2];
      cVar8 = pcVar1[3];
      cVar9 = pcVar1[4];
      cVar10 = pcVar1[5];
      cVar11 = pcVar1[6];
      cVar12 = pcVar1[7];
      cVar13 = pcVar1[8];
      cVar14 = pcVar1[9];
      cVar15 = pcVar1[10];
      cVar16 = pcVar1[0xb];
      cVar17 = pcVar1[0xc];
      cVar18 = pcVar1[0xd];
      cVar19 = pcVar1[0xe];
      cVar20 = pcVar1[0xf];
      pbVar2 = (byte *)(pcVar4 + uVar26);
      *pbVar2 = -(*pcVar1 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[1] = -(cVar6 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[2] = -(cVar7 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[3] = -(cVar8 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[4] = -(cVar9 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[5] = -(cVar10 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[6] = -(cVar11 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[7] = -(cVar12 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[8] = -(cVar13 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[9] = -(cVar14 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[10] = -(cVar15 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xb] = -(cVar16 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xc] = -(cVar17 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xd] = -(cVar18 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xe] = -(cVar19 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xf] = -(cVar20 < '\0') & 0x7eU ^ 0xfe;
      uVar26 = uVar26 + 0x10;
    } while (uVar3 + 1 != uVar26);
  }
  uVar21 = *(undefined8 *)(pcVar4 + 8);
  *(undefined8 *)(pcVar22 + 1) = *(undefined8 *)pcVar4;
  *(undefined8 *)(pcVar22 + 9) = uVar21;
  *pcVar22 = -1;
  sVar23 = this->capacity_;
  if (sVar23 != 0) {
    local_78 = (new_allocator<std::pair<std::__cxx11::string_const,std::function<bool(std::__cxx11::string_const&)>>>
                *)&this->settings_;
    i = 0;
    do {
      if (this->ctrl_[i] == -2) {
        sVar23 = std::
                 hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator()(&local_79,&this->slots_[i].value.first);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = sVar23;
        uVar26 = SUB168(auVar5 * ZEXT816(0xde5fb9d2630458e9),8) +
                 SUB168(auVar5 * ZEXT816(0xde5fb9d2630458e9),0);
        FVar28 = find_first_non_full(this,uVar26);
        sVar23 = FVar28.offset;
        uVar3 = this->capacity_;
        if ((uVar3 + 1 & uVar3) != 0) {
          __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                        ,0x96,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
        }
        uVar24 = uVar26 >> 7 & uVar3;
        bVar27 = (byte)uVar26;
        if (((i - uVar24 ^ sVar23 - uVar24) & uVar3) < 0x10) {
          bVar27 = bVar27 & 0x7f;
        }
        else {
          if (this->ctrl_[sVar23] == -2) {
            set_ctrl(this,sVar23,bVar27 & 0x7f);
            psVar25 = this->slots_;
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
            ::pair(&local_70,&psVar25[i].value);
            __gnu_cxx::
            new_allocator<std::pair<std::__cxx11::string_const,std::function<bool(std::__cxx11::string_const&)>>>
            ::
            destroy<std::pair<std::__cxx11::string_const,std::function<bool(std::__cxx11::string_const&)>>>
                      (local_78,&psVar25[i].value);
            psVar25 = this->slots_ + sVar23;
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
            ::pair(&this->slots_[i].value,&psVar25->value);
            this_00 = local_78;
            __gnu_cxx::
            new_allocator<std::pair<std::__cxx11::string_const,std::function<bool(std::__cxx11::string_const&)>>>
            ::
            destroy<std::pair<std::__cxx11::string_const,std::function<bool(std::__cxx11::string_const&)>>>
                      (local_78,&psVar25->value);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
            ::pair(&this->slots_[sVar23].value,&local_70);
            __gnu_cxx::
            new_allocator<std::pair<std::__cxx11::string_const,std::function<bool(std::__cxx11::string_const&)>>>
            ::
            destroy<std::pair<std::__cxx11::string_const,std::function<bool(std::__cxx11::string_const&)>>>
                      (this_00,&local_70);
            i = i - 1;
            goto LAB_0012ab35;
          }
          if (this->ctrl_[sVar23] != -0x80) {
            __assert_fail("IsDeleted(ctrl_[new_i])",
                          "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                          ,0x92b,
                          "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::basic_string<char>, std::function<bool (const std::basic_string<char> &)>>, phmap::Hash<std::basic_string<char>>, phmap::EqualTo<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, std::function<bool (const std::basic_string<char> &)>>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashMapPolicy<std::basic_string<char>, std::function<bool (const std::basic_string<char> &)>>, Hash = phmap::Hash<std::basic_string<char>>, Eq = phmap::EqualTo<std::basic_string<char>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, std::function<bool (const std::basic_string<char> &)>>>]"
                         );
          }
          set_ctrl(this,sVar23,bVar27 & 0x7f);
          psVar25 = this->slots_ + i;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
          ::pair(&this->slots_[sVar23].value,&psVar25->value);
          __gnu_cxx::
          new_allocator<std::pair<std::__cxx11::string_const,std::function<bool(std::__cxx11::string_const&)>>>
          ::
          destroy<std::pair<std::__cxx11::string_const,std::function<bool(std::__cxx11::string_const&)>>>
                    (local_78,&psVar25->value);
          bVar27 = 0x80;
        }
        set_ctrl(this,i,bVar27);
      }
LAB_0012ab35:
      i = i + 1;
      sVar23 = this->capacity_;
    } while (i != sVar23);
  }
  reset_growth_left(this,sVar23);
  return;
}

Assistant:

void drop_deletes_without_resize() PHMAP_ATTRIBUTE_NOINLINE {
				assert(IsValidCapacity(capacity_));
				assert(!is_small());
				// Algorithm:
				// - mark all DELETED slots as EMPTY
				// - mark all FULL slots as DELETED
				// - for each slot marked as DELETED
				//     hash = Hash(element)
				//     target = find_first_non_full(hash)
				//     if target is in the same group
				//       mark slot as FULL
				//     else if target is EMPTY
				//       transfer element to target
				//       mark slot as EMPTY
				//       mark target as FULL
				//     else if target is DELETED
				//       swap current element with target element
				//       mark target as FULL
				//       repeat procedure for current slot with moved from element (target)
				ConvertDeletedToEmptyAndFullToDeleted(ctrl_, capacity_);
				typename phmap::aligned_storage<sizeof(slot_type), alignof(slot_type)>::type
				raw;
				slot_type* slot = reinterpret_cast<slot_type*>(&raw);
				for (size_t i = 0; i != capacity_; ++i)
				{
					if (!IsDeleted(ctrl_[i])) continue;
					size_t hashval = PolicyTraits::apply(HashElement{hash_ref()},
					PolicyTraits::element(slots_ + i));
					auto target = find_first_non_full(hashval);
					size_t new_i = target.offset;

					// Verify if the old and new i fall within the same group wrt the hashval.
					// If they do, we don't need to move the object as it falls already in the
					// best probe we can.
					const auto probe_index = [&](size_t pos) {
						return ((pos - probe(hashval).offset()) & capacity_) / Group::kWidth;
					};

					// Element doesn't move.
					if (PHMAP_PREDICT_TRUE(probe_index(new_i) == probe_index(i))) {
						set_ctrl(i, H2(hashval));
						continue;
					}
					if (IsEmpty(ctrl_[new_i])) {
						// Transfer element to the empty spot.
						// set_ctrl poisons/unpoisons the slots so we have to call it at the
						// right time.
						set_ctrl(new_i, H2(hashval));
						PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slots_ + i);
						set_ctrl(i, kEmpty);
					}
					else {
						assert(IsDeleted(ctrl_[new_i]));
						set_ctrl(new_i, H2(hashval));
						// Until we are done rehashing, DELETED marks previously FULL slots.
						// Swap i and new_i elements.
						PolicyTraits::transfer(&alloc_ref(), slot, slots_ + i);
						PolicyTraits::transfer(&alloc_ref(), slots_ + i, slots_ + new_i);
						PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slot);
						--i;  // repeat
					}
				}
				reset_growth_left(capacity_);
			}